

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::GPUShaderFP64Test2::getUniformTypeMemberSize
          (GPUShaderFP64Test2 *this,uniformTypeDetails *uniform_type)

{
  int iVar1;
  
  if (getUniformTypeMemberSize(gl4cts::GPUShaderFP64Test2::uniformTypeDetails_const&)::vec4_size ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&getUniformTypeMemberSize(gl4cts::GPUShaderFP64Test2::uniformTypeDetails_const&)
                                 ::vec4_size);
    if (iVar1 != 0) {
      getUniformTypeMemberSize::vec4_size = 0x10;
      __cxa_guard_release(&getUniformTypeMemberSize(gl4cts::GPUShaderFP64Test2::uniformTypeDetails_const&)
                           ::vec4_size);
    }
  }
  return (uniform_type->m_n_rows + 1 >> 1) * getUniformTypeMemberSize::vec4_size *
         uniform_type->m_n_columns;
}

Assistant:

glw::GLuint GPUShaderFP64Test2::getUniformTypeMemberSize(const uniformTypeDetails& uniform_type) const
{
	static const glw::GLuint vec4_size	 = 4 * Utils::getBaseVariableTypeComponentSize(Utils::VARIABLE_TYPE_FLOAT);
	const glw::GLuint		 column_length = uniform_type.m_n_rows;

	/** Size for a layout(std140, column_major) uniform_type uniform[] **/
	return vec4_size * ((column_length + 1) / 2) * uniform_type.m_n_columns;
}